

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadraticLikeCost.cpp
# Opt level: O0

void __thiscall
iDynTree::optimalcontrol::QuadraticLikeCost::QuadraticLikeCost
          (QuadraticLikeCost *this,string *costName)

{
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffff88;
  SparsityStructure *in_stack_ffffffffffffff90;
  SparsityStructure *this_00;
  
  Cost::Cost((Cost *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *in_RDI = &PTR__QuadraticLikeCost_003fade0;
  std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>_>::shared_ptr
            ((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>_> *)
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>::shared_ptr
            ((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_> *)
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>_>::shared_ptr
            ((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>_> *)
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>_>::shared_ptr
            ((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>_> *)
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_>::shared_ptr
            ((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_> *)
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>_>::shared_ptr
            ((shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>_> *)
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *(undefined1 *)(in_RDI + 0x11) = 0;
  *(undefined1 *)((long)in_RDI + 0x89) = 0;
  *(undefined1 *)((long)in_RDI + 0x8a) = 0;
  SparsityStructure::SparsityStructure(in_stack_ffffffffffffff90);
  this_00 = (SparsityStructure *)(in_RDI + 0x1f);
  SparsityStructure::SparsityStructure(this_00);
  SparsityStructure::SparsityStructure(this_00);
  return;
}

Assistant:

QuadraticLikeCost::QuadraticLikeCost(const std::string &costName)
            : Cost(costName)
            , m_timeVaryingStateHessian(nullptr)
            , m_timeVaryingStateGradient(nullptr)
            , m_timeVaryingStateCostBias(nullptr)
            , m_timeVaryingControlHessian(nullptr)
            , m_timeVaryingControlGradient(nullptr)
            , m_timeVaryingControlCostBias(nullptr)
            , m_hasSecondPartialDerivativeWRTStateSparsity(false)
            , m_hasSecondPartialDerivativeWRTControlSparsity(false)
            , m_hasSecondPartialDerivativeWRTStateControlSparsity(false)
        { }